

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::UnknownField::InternalSerializeLengthDelimitedNoTag
          (UnknownField *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t value;
  pointer data;
  Nullable<const_char_*> failure_msg;
  uint8_t *puVar1;
  Type local_34;
  LogMessageFatal local_30;
  
  local_30.super_LogMessage.errno_saver_.saved_errno_ = 3;
  local_34 = this->type_;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::UnknownField::Type,google::protobuf::UnknownField::Type>
                          ((Type *)&local_30,&local_34,"TYPE_LENGTH_DELIMITED == type()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    data = (((this->data_).string_value)->_M_dataplus)._M_p;
    value = (uint32_t)((this->data_).string_value)->_M_string_length;
    puVar1 = io::CodedOutputStream::WriteVarint32ToArray(value,target);
    puVar1 = io::EpsCopyOutputStream::WriteRaw(stream,data,value,puVar1);
    return puVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.cc"
             ,0x11b,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

uint8_t* UnknownField::InternalSerializeLengthDelimitedNoTag(
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  ABSL_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const absl::string_view data = *data_.string_value;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = stream->WriteRaw(data.data(), data.size(), target);
  return target;
}